

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

void __thiscall QHeaderView::updateSection(QHeaderView *this,int logicalIndex)

{
  long lVar1;
  QWidget *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  QRect local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  this_00 = *(QWidget **)(lVar1 + 0x2b0);
  if (*(int *)(lVar1 + 0x548) == 1) {
    iVar2 = sectionViewportPosition(this,logicalIndex);
    iVar3 = sectionSize(this,logicalIndex);
    lVar1 = *(long *)(*(long *)(lVar1 + 0x2b0) + 0x20);
    local_40.y2.m_i = *(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18);
    local_40.y1.m_i = 0;
    local_40.x1.m_i = iVar2;
    local_40.x2.m_i = iVar3 + iVar2 + -1;
  }
  else {
    iVar4 = sectionViewportPosition(this,logicalIndex);
    lVar1 = *(long *)(*(long *)(lVar1 + 0x2b0) + 0x20);
    iVar2 = *(int *)(lVar1 + 0x1c);
    iVar3 = *(int *)(lVar1 + 0x14);
    iVar5 = sectionSize(this,logicalIndex);
    local_40.x1.m_i = 0;
    local_40.y2.m_i = iVar5 + iVar4 + -1;
    local_40.y1.m_i = iVar4;
    local_40.x2.m_i = iVar2 - iVar3;
  }
  QWidget::update(this_00,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHeaderView::updateSection(int logicalIndex)
{
    Q_D(QHeaderView);
    if (d->orientation == Qt::Horizontal)
        d->viewport->update(QRect(sectionViewportPosition(logicalIndex),
                                  0, sectionSize(logicalIndex), d->viewport->height()));
    else
        d->viewport->update(QRect(0, sectionViewportPosition(logicalIndex),
                                  d->viewport->width(), sectionSize(logicalIndex)));
}